

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void plot_getrect(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_float basex,
                 t_float basey,int *xp1,int *yp1,int *xp2,int *yp2)

{
  int iVar1;
  _parentwidgetbehavior *p_Var2;
  float fVar3;
  t_float tVar4;
  t_float local_154;
  _parentwidgetbehavior *wb;
  int yy2;
  int yy1;
  int xx2;
  int xx1;
  t_gobj *y;
  float local_110;
  t_float useyloc;
  t_float usexloc;
  int incr;
  _fielddesc *wfielddesc;
  _fielddesc *yfielddesc;
  _fielddesc *xfielddesc;
  t_float wpix;
  t_float ypix;
  t_float xpix;
  int i;
  int y2;
  int x2;
  int y1;
  int x1;
  _array *array;
  double xsum;
  float local_b8;
  t_float edit;
  t_float scalarvis;
  t_float vis;
  t_float yval;
  t_float style;
  t_float yloc;
  t_float xinc;
  t_float xloc;
  t_float linewidth;
  t_symbol *elemtemplatesym;
  t_template *elemtemplate;
  _glist *elemtemplatecanvas;
  int xonset;
  int wonset;
  int yonset;
  int elemsize;
  t_plot *x;
  int *yp1_local;
  int *xp1_local;
  t_float basey_local;
  t_float basex_local;
  t_template *template_local;
  t_word *data_local;
  _glist *glist_local;
  t_gobj *z_local;
  
  x2 = 0x7fffffff;
  y2 = 0x7fffffff;
  i = -0x7fffffff;
  xpix = -1.4013e-45;
  if ((glist->gl_list == (t_gobj *)0x0) || (glist->gl_list->g_next != (_gobj *)0x0)) {
    _yonset = z;
    x = (t_plot *)yp1;
    yp1_local = xp1;
    xp1_local._0_4_ = basey;
    xp1_local._4_4_ = basex;
    _basey_local = template;
    template_local = (t_template *)data;
    data_local = (t_word *)glist;
    glist_local = (_glist *)z;
    iVar1 = plot_readownertemplate
                      ((t_plot *)z,data,template,(t_symbol **)&xloc,(_array **)&y1,&xinc,&yloc,
                       &style,&yval,&vis,&edit,&local_b8,(t_float *)((long)&xsum + 4),&yfielddesc,
                       &wfielddesc,(_fielddesc **)&usexloc);
    if ((iVar1 == 0) &&
       (((edit != 0.0 || (NAN(edit))) &&
        (iVar1 = array_getfields(_xloc,(_glist **)&elemtemplate,(t_template **)&elemtemplatesym,
                                 &wonset,yfielddesc,wfielddesc,_usexloc,(int *)&elemtemplatecanvas,
                                 &xonset,(int *)((long)&elemtemplatecanvas + 4)), iVar1 == 0)))) {
      if (_y1->a_n < 0x7d1) {
        local_154 = 1.4013e-45;
      }
      else {
        local_154 = (t_float)(_y1->a_n / 1000);
      }
      useyloc = local_154;
      array = (_array *)0x0;
      for (ypix = 0.0; (int)ypix < _y1->a_n; ypix = (t_float)((int)useyloc + (int)ypix)) {
        array_getcoordinate((_glist *)data_local,_y1->a_vec + (int)ypix * wonset,
                            (int)elemtemplatecanvas,xonset,elemtemplatecanvas._4_4_,(int)ypix,
                            xp1_local._4_4_ + yloc,xp1_local._0_4_ + yval,style,yfielddesc,
                            wfielddesc,_usexloc,&wpix,(t_float *)((long)&xfielddesc + 4),
                            (t_float *)&xfielddesc);
        if (wpix < (float)x2) {
          x2 = (int)wpix;
        }
        if ((float)i < wpix) {
          i = (int)wpix;
        }
        if (xfielddesc._4_4_ - xfielddesc._0_4_ < (float)y2) {
          y2 = (int)(xfielddesc._4_4_ - xfielddesc._0_4_);
        }
        if ((float)(int)xpix < xfielddesc._4_4_ + xfielddesc._0_4_) {
          xpix = (t_float)(int)(xfielddesc._4_4_ + xfielddesc._0_4_);
        }
        if ((local_b8 != 0.0) || (NAN(local_b8))) {
          if ((int)elemtemplatecanvas < 0) {
            local_110 = (float)((double)xp1_local._4_4_ + (double)array);
            array = (_array *)((double)style + (double)array);
          }
          else {
            fVar3 = xp1_local._4_4_ + yloc;
            tVar4 = fielddesc_cvttocoord
                              (yfielddesc,
                               *(t_float *)
                                (_y1->a_vec +
                                (long)(int)elemtemplatecanvas + (long)(wonset * (int)ypix)));
            local_110 = fVar3 + tVar4;
          }
          if (xonset < 0) {
            scalarvis = 0.0;
          }
          else {
            scalarvis = *(t_float *)(_y1->a_vec + (long)xonset + (long)(wonset * (int)ypix));
          }
          fVar3 = xp1_local._0_4_ + yval;
          tVar4 = fielddesc_cvttocoord(wfielddesc,scalarvis);
          y._4_4_ = fVar3 + tVar4;
          for (_xx2 = elemtemplate[1].t_pdobj; _xx2 != (t_pd)0x0; _xx2 = (t_pd)_xx2->c_helpname) {
            p_Var2 = pd_getparentwidget((t_pd *)_xx2);
            if (p_Var2 != (_parentwidgetbehavior *)0x0) {
              (*p_Var2->w_parentgetrectfn)
                        ((t_gobj *)_xx2,(_glist *)data_local,
                         (t_word *)(_y1->a_vec + wonset * (int)ypix),(t_template *)elemtemplatesym,
                         local_110,y._4_4_,&yy1,(int *)((long)&wb + 4),&yy2,(int *)&wb);
              if (yy1 < x2) {
                x2 = yy1;
              }
              if (wb._4_4_ < y2) {
                y2 = wb._4_4_;
              }
              if (i < yy2) {
                i = yy2;
              }
              if ((int)xpix < (int)wb._0_4_) {
                xpix = wb._0_4_;
              }
            }
          }
        }
      }
    }
    *yp1_local = x2;
    *(int *)&(x->x_obj).te_g.g_pd = y2;
    *xp2 = i;
    *yp2 = (int)xpix;
  }
  else {
    *yp1 = -0x7fffffff;
    *xp1 = -0x7fffffff;
    *yp2 = 0x7fffffff;
    *xp2 = 0x7fffffff;
  }
  return;
}

Assistant:

static void plot_getrect(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_float basex, t_float basey,
    int *xp1, int *yp1, int *xp2, int *yp2)
{
    t_plot *x = (t_plot *)z;
    int elemsize, yonset, wonset, xonset;
    t_canvas *elemtemplatecanvas;
    t_template *elemtemplate;
    t_symbol *elemtemplatesym;
    t_float linewidth, xloc, xinc, yloc, style, yval, vis, scalarvis, edit;
    double xsum;
    t_array *array;
    int x1 = 0x7fffffff, y1 = 0x7fffffff, x2 = -0x7fffffff, y2 = -0x7fffffff;
    int i;
    t_float xpix, ypix, wpix;
    t_fielddesc *xfielddesc, *yfielddesc, *wfielddesc;
        /* if we're the only plot in the glist claim the whole thing */
    if (glist->gl_list && !glist->gl_list->g_next)
    {
        *xp1 = *yp1 = -0x7fffffff;
        *xp2 = *yp2 = 0x7fffffff;
        return;
    }
    if (!plot_readownertemplate(x, data, template,
        &elemtemplatesym, &array, &linewidth, &xloc, &xinc, &yloc, &style,
            &vis, &scalarvis, &edit, &xfielddesc, &yfielddesc, &wfielddesc) &&
                (vis != 0) &&
            !array_getfields(elemtemplatesym, &elemtemplatecanvas,
                &elemtemplate, &elemsize,
                xfielddesc, yfielddesc, wfielddesc,
                &xonset, &yonset, &wonset))
    {
            /* if it has more than 2000 points, just check 1000 of them. */
        int incr = (array->a_n <= 2000 ? 1 : array->a_n / 1000);
        for (i = 0, xsum = 0; i < array->a_n; i += incr)
        {
            t_float usexloc, useyloc;
            t_gobj *y;
                /* get the coords of the point proper */
            array_getcoordinate(glist, (char *)(array->a_vec) + i * elemsize,
                xonset, yonset, wonset, i, basex + xloc, basey + yloc, xinc,
                xfielddesc, yfielddesc, wfielddesc, &xpix, &ypix, &wpix);
            if (xpix < x1)
                x1 = xpix;
            if (xpix > x2)
                x2 = xpix;
            if (ypix - wpix < y1)
                y1 = ypix - wpix;
            if (ypix + wpix > y2)
                y2 = ypix + wpix;

            if (scalarvis != 0)
            {
                    /* check also the drawing instructions for the scalar */
                if (xonset >= 0)
                    usexloc = basex + xloc + fielddesc_cvttocoord(xfielddesc,
                        *(t_float *)(((char *)(array->a_vec) + elemsize * i)
                            + xonset));
                else usexloc = basex + xsum, xsum += xinc;
                if (yonset >= 0)
                    yval = *(t_float *)(((char *)(array->a_vec) + elemsize * i)
                        + yonset);
                else yval = 0;
                useyloc = basey + yloc + fielddesc_cvttocoord(yfielddesc, yval);
                for (y = elemtemplatecanvas->gl_list; y; y = y->g_next)
                {
                    int xx1, xx2, yy1, yy2;
                    const t_parentwidgetbehavior *wb =
                        pd_getparentwidget(&y->g_pd);
                    if (!wb) continue;
                    (*wb->w_parentgetrectfn)(y, glist,
                        (t_word *)((char *)(array->a_vec) + elemsize * i),
                            elemtemplate, usexloc, useyloc,
                                &xx1, &yy1, &xx2, &yy2);
                    if (xx1 < x1)
                        x1 = xx1;
                    if (yy1 < y1)
                        y1 = yy1;
                     if (xx2 > x2)
                        x2 = xx2;
                    if (yy2 > y2)
                        y2 = yy2;
                }
            }
        }
    }

    *xp1 = x1;
    *yp1 = y1;
    *xp2 = x2;
    *yp2 = y2;
}